

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

FeatureVectorizer * __thiscall CoreML::Specification::Model::mutable_featurevectorizer(Model *this)

{
  bool bVar1;
  FeatureVectorizer *this_00;
  Model *this_local;
  
  bVar1 = has_featurevectorizer(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_featurevectorizer(this);
    this_00 = (FeatureVectorizer *)operator_new(0x30);
    FeatureVectorizer::FeatureVectorizer(this_00);
    (this->Type_).featurevectorizer_ = this_00;
  }
  return (FeatureVectorizer *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::FeatureVectorizer* Model::mutable_featurevectorizer() {
  if (!has_featurevectorizer()) {
    clear_Type();
    set_has_featurevectorizer();
    Type_.featurevectorizer_ = new ::CoreML::Specification::FeatureVectorizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.featureVectorizer)
  return Type_.featurevectorizer_;
}